

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_scalar_dquo
          (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,csubstr s,size_t ilevel)

{
  csubstr sp;
  csubstr sp_00;
  csubstr sp_01;
  csubstr sp_02;
  csubstr sp_03;
  ro_substr chars;
  bool bVar1;
  error_flags eVar2;
  long in_RCX;
  char *in_RDX;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  csubstr sub_4;
  csubstr sub_3;
  csubstr sub_2;
  size_t next_1;
  char next;
  size_t lv;
  csubstr sub_1;
  csubstr sub;
  char curr;
  size_t i;
  size_t pos;
  undefined4 in_stack_fffffffffffffc58;
  error_flags in_stack_fffffffffffffc5c;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  error_flags in_stack_fffffffffffffc6c;
  undefined4 in_stack_fffffffffffffc70;
  error_flags in_stack_fffffffffffffc74;
  char *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  error_flags in_stack_fffffffffffffc84;
  undefined4 in_stack_fffffffffffffc90;
  error_flags in_stack_fffffffffffffc94;
  undefined4 in_stack_fffffffffffffc98;
  error_flags in_stack_fffffffffffffc9c;
  char *in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca8;
  error_flags in_stack_fffffffffffffcac;
  char *local_328;
  char *local_2f0;
  basic_substring<char_const> local_270 [16];
  char *local_260;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_251;
  ulong local_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_201;
  char *local_200;
  char *local_1f8;
  long local_1f0;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  char *local_1d0;
  undefined4 local_1c8;
  char *local_1c0;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1b8;
  char *local_1a0;
  undefined4 local_198;
  char *local_190;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_188;
  char *local_180;
  undefined4 local_178;
  char *local_170;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_168;
  char *local_160;
  undefined4 local_158;
  char *local_150;
  undefined4 local_148;
  char *local_140;
  undefined4 local_138;
  char *local_130;
  char *local_128;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_120;
  char *local_108;
  undefined4 local_100;
  char *local_f8;
  undefined4 local_f0;
  char *local_e8;
  undefined4 local_e0;
  char *local_d8;
  char *local_d0;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c8;
  char *local_b0;
  undefined4 local_a8;
  char *local_a0;
  undefined4 local_98;
  char *local_90;
  undefined4 local_88;
  char *local_80;
  char *local_78;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_70;
  undefined8 local_68;
  undefined8 local_60;
  char *local_58;
  undefined4 local_50;
  char *local_48;
  undefined4 local_40;
  char *local_38;
  undefined4 local_30;
  char *local_28;
  char *local_20;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_1f8 = (char *)0x0;
  local_1f0 = in_RCX;
  local_1e0.m_stream = in_RSI;
  local_1e0.m_pos = (size_t)in_RDX;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_do_write(in_stack_fffffffffffffc60,(char)(in_stack_fffffffffffffc5c >> 0x18));
  for (local_200 = (char *)0x0; local_200 < local_1e0.m_pos; local_200 = local_200 + 1) {
    local_201 = local_1e0.m_stream[(long)local_200];
    if ((local_201 == (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0x22
        ) || (local_201 ==
              (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0x5c)) {
      local_18 = &local_1e0;
      local_20 = local_1f8;
      local_28 = local_200;
      if (local_1e0.m_pos < local_1f8) {
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        local_38 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_30 = 0x1544;
        handle_error(0x389522,(char *)0x1544,"check failed: %s","first >= 0 && first <= len");
      }
      if (local_28 == (char *)0xffffffffffffffff) {
        local_2f0 = (char *)local_1e0.m_pos;
      }
      else {
        local_2f0 = local_28;
      }
      local_28 = local_2f0;
      if (local_2f0 < local_20) {
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        local_48 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_40 = 0x1546;
        handle_error(0x389522,(char *)0x1546,"check failed: %s","first <= last");
      }
      if (local_1e0.m_pos < local_28) {
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        local_58 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_50 = 0x1547;
        handle_error(0x389522,(char *)0x1547,"check failed: %s","last >= 0 && last <= len");
      }
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)
                 CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                 in_stack_fffffffffffffc78,
                 CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
      local_218 = local_10;
      local_210 = local_8;
      local_228 = local_10;
      local_220 = local_8;
      sp.str._4_4_ = in_stack_fffffffffffffc74;
      sp.str._0_4_ = in_stack_fffffffffffffc70;
      sp.len = (size_t)in_stack_fffffffffffffc78;
      WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),sp);
      WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(in_stack_fffffffffffffc60,(char)(in_stack_fffffffffffffc5c >> 0x18));
      WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(in_stack_fffffffffffffc60,(char)(in_stack_fffffffffffffc5c >> 0x18));
      local_1f8 = local_200 + 1;
    }
    else {
      local_168 = &local_1e0;
      local_170 = local_200;
      if (local_1e0.m_pos <= local_200) {
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        local_180 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_178 = 0x14c3;
        handle_error(0x389522,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
      }
      if (local_1e0.m_stream[(long)local_170] ==
          (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0xa) {
        local_80 = local_200 + 1;
        local_70 = &local_1e0;
        local_78 = local_1f8;
        if (local_1e0.m_pos < local_1f8) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_90 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_88 = 0x1544;
          handle_error(0x389522,(char *)0x1544,"check failed: %s","first >= 0 && first <= len");
        }
        if (local_80 == (char *)0xffffffffffffffff) {
          local_328 = (char *)local_1e0.m_pos;
        }
        else {
          local_328 = local_80;
        }
        local_80 = local_328;
        if (local_328 < local_78) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_a0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_98 = 0x1546;
          handle_error(0x389522,(char *)0x1546,"check failed: %s","first <= last");
        }
        if (local_1e0.m_pos < local_80) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_b0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_a8 = 0x1547;
          handle_error(0x389522,(char *)0x1547,"check failed: %s","last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)
                   CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                   in_stack_fffffffffffffc78,
                   CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
        local_238 = local_68;
        local_230 = local_60;
        local_248 = local_68;
        local_240 = local_60;
        sp_00.str._4_4_ = in_stack_fffffffffffffc74;
        sp_00.str._0_4_ = in_stack_fffffffffffffc70;
        sp_00.len = (size_t)in_stack_fffffffffffffc78;
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),sp_00);
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(in_stack_fffffffffffffc60,(char)(in_stack_fffffffffffffc5c >> 0x18));
        if (local_200 + 1 < local_1e0.m_pos) {
          for (local_250 = 0; local_250 < local_1f0 + 1U; local_250 = local_250 + 1) {
            WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_do_write(in_stack_fffffffffffffc60,(char)(in_stack_fffffffffffffc5c >> 0x18));
            WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_do_write(in_stack_fffffffffffffc60,(char)(in_stack_fffffffffffffc5c >> 0x18));
          }
        }
        local_1f8 = local_200 + 1;
        if ((local_200 + 1 < local_1e0.m_pos) &&
           ((local_251 = (local_1e0.m_stream + 1)[(long)local_200],
            local_251 ==
            (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0x20 ||
            (local_251 ==
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0x9)))) {
          WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write(in_stack_fffffffffffffc60,(char)(in_stack_fffffffffffffc5c >> 0x18));
        }
      }
      else if ((local_201 ==
                (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0x20) ||
              (local_201 ==
               (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0x9)) {
        basic_substring<char_const>::basic_substring<4ul>(local_270,(char (*) [4])" \t\r");
        chars.len._0_4_ = in_stack_fffffffffffffca8;
        chars.str = in_stack_fffffffffffffca0;
        chars.len._4_4_ = in_stack_fffffffffffffcac;
        local_260 = (char *)basic_substring<const_char>::first_not_of
                                      ((basic_substring<const_char> *)
                                       CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98)
                                       ,chars,CONCAT44(in_stack_fffffffffffffc94,
                                                       in_stack_fffffffffffffc90));
        if (local_260 != (char *)0xffffffffffffffff) {
          local_188 = &local_1e0;
          local_190 = local_260;
          if (local_1e0.m_pos <= local_260) {
            eVar2 = get_error_flags();
            if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            local_1a0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_198 = 0x14c3;
            handle_error(0x389522,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
          }
          if (local_1e0.m_stream[(long)local_190] ==
              (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0xa) {
            local_c8 = &local_1e0;
            local_d0 = local_1f8;
            local_d8 = local_200;
            if (local_1e0.m_pos < local_1f8) {
              in_stack_fffffffffffffcac = get_error_flags();
              if ((in_stack_fffffffffffffcac & 1) != 0) {
                bVar1 = is_debugger_attached();
                in_stack_fffffffffffffca8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffca8);
                if (bVar1) {
                  trap_instruction();
                }
              }
              local_e8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_e0 = 0x1544;
              handle_error(0x389522,(char *)0x1544,"check failed: %s","first >= 0 && first <= len");
            }
            in_stack_fffffffffffffca0 = (char *)local_1e0.m_pos;
            if (local_d8 != (char *)0xffffffffffffffff) {
              in_stack_fffffffffffffca0 = local_d8;
            }
            local_d8 = in_stack_fffffffffffffca0;
            if (in_stack_fffffffffffffca0 < local_d0) {
              in_stack_fffffffffffffc9c = get_error_flags();
              if ((in_stack_fffffffffffffc9c & 1) != 0) {
                bVar1 = is_debugger_attached();
                in_stack_fffffffffffffc98 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc98);
                if (bVar1) {
                  trap_instruction();
                }
              }
              local_f8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_f0 = 0x1546;
              handle_error(0x389522,(char *)0x1546,"check failed: %s","first <= last");
            }
            if (local_1e0.m_pos < local_d8) {
              in_stack_fffffffffffffc94 = get_error_flags();
              if ((in_stack_fffffffffffffc94 & 1) != 0) {
                bVar1 = is_debugger_attached();
                in_stack_fffffffffffffc90 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc90);
                if (bVar1) {
                  trap_instruction();
                }
              }
              local_108 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_100 = 0x1547;
              handle_error(0x389522,(char *)0x1547,"check failed: %s","last >= 0 && last <= len");
            }
            basic_substring<const_char>::basic_substring
                      ((basic_substring<const_char> *)
                       CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                       in_stack_fffffffffffffc78,
                       CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
            sp_01.str._4_4_ = in_stack_fffffffffffffc74;
            sp_01.str._0_4_ = in_stack_fffffffffffffc70;
            sp_01.len = (size_t)in_stack_fffffffffffffc78;
            WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),sp_01);
            WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_do_write(in_stack_fffffffffffffc60,(char)(in_stack_fffffffffffffc5c >> 0x18));
            local_1f8 = local_200;
          }
        }
      }
      else if (local_201 ==
               (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0xd) {
        local_120 = &local_1e0;
        local_128 = local_1f8;
        local_130 = local_200;
        if (local_1e0.m_pos < local_1f8) {
          in_stack_fffffffffffffc84 = get_error_flags();
          if ((in_stack_fffffffffffffc84 & 1) != 0) {
            bVar1 = is_debugger_attached();
            in_stack_fffffffffffffc80 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc80);
            if (bVar1) {
              trap_instruction();
            }
          }
          local_140 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_138 = 0x1544;
          handle_error(0x389522,(char *)0x1544,"check failed: %s","first >= 0 && first <= len");
        }
        in_stack_fffffffffffffc78 = (char *)local_1e0.m_pos;
        if (local_130 != (char *)0xffffffffffffffff) {
          in_stack_fffffffffffffc78 = local_130;
        }
        local_130 = in_stack_fffffffffffffc78;
        if (in_stack_fffffffffffffc78 < local_128) {
          in_stack_fffffffffffffc74 = get_error_flags();
          if ((in_stack_fffffffffffffc74 & 1) != 0) {
            bVar1 = is_debugger_attached();
            in_stack_fffffffffffffc70 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc70);
            if (bVar1) {
              trap_instruction();
            }
          }
          local_150 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_148 = 0x1546;
          handle_error(0x389522,(char *)0x1546,"check failed: %s","first <= last");
        }
        if (local_1e0.m_pos < local_130) {
          in_stack_fffffffffffffc6c = get_error_flags();
          if ((in_stack_fffffffffffffc6c & 1) != 0) {
            bVar1 = is_debugger_attached();
            in_stack_fffffffffffffc68 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc68);
            if (bVar1) {
              trap_instruction();
            }
          }
          local_160 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_158 = 0x1547;
          handle_error(0x389522,(char *)0x1547,"check failed: %s","last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)
                   CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                   in_stack_fffffffffffffc78,
                   CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
        sp_02.str._4_4_ = in_stack_fffffffffffffc74;
        sp_02.str._0_4_ = in_stack_fffffffffffffc70;
        sp_02.len = (size_t)in_stack_fffffffffffffc78;
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),sp_02);
        WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
                  (in_stack_fffffffffffffc60,
                   (char (*) [3])CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
        local_1f8 = local_200 + 1;
      }
    }
  }
  if (local_1f8 < local_1e0.m_pos) {
    in_stack_fffffffffffffc60 = &local_1e0;
    local_1c0 = local_1f8;
    local_1b8 = in_stack_fffffffffffffc60;
    if (local_1e0.m_pos < local_1f8) {
      in_stack_fffffffffffffc5c = get_error_flags();
      if (((in_stack_fffffffffffffc5c & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      local_1d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_1c8 = 0x1533;
      handle_error(0x389522,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              ((basic_substring<const_char> *)
               CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
               in_stack_fffffffffffffc78,
               CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
    sp_03.str._4_4_ = in_stack_fffffffffffffc74;
    sp_03.str._0_4_ = in_stack_fffffffffffffc70;
    sp_03.len = (size_t)in_stack_fffffffffffffc78;
    WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),sp_03);
  }
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_do_write(in_stack_fffffffffffffc60,(char)(in_stack_fffffffffffffc5c >> 0x18));
  return;
}

Assistant:

void Emitter<Writer>::_write_scalar_dquo(csubstr s, size_t ilevel)
{
    size_t pos = 0; // tracks the last character that was already written
    this->Writer::_do_write('"');
    for(size_t i = 0; i < s.len; ++i)
    {
        const char curr = s.str[i];
        if(curr == '"' || curr == '\\')
        {
            csubstr sub = s.range(pos, i);
            this->Writer::_do_write(sub);  // write everything up to (excluding) this char
            this->Writer::_do_write('\\'); // write the escape
            this->Writer::_do_write(curr); // write the char
            pos = i+1;
        }
        else if(s[i] == '\n')
        {
            csubstr sub = s.range(pos, i+1);
            this->Writer::_do_write(sub);  // write everything up to (including) this newline
            this->Writer::_do_write('\n'); // write the newline again
            if(i + 1 < s.len)
                _rymlindent_nextline()     // indent the next line
            pos = i+1;
            if(i+1 < s.len) // escape leading whitespace after the newline
            {
                const char next = s.str[i+1];
                if(next == ' ' || next == '\t')
                    this->Writer::_do_write('\\');
            }
        }
        else if(curr == ' ' || curr == '\t')
        {
            // escape trailing whitespace before a newline
            size_t next = s.first_not_of(" \t\r", i);
            if(next != npos && s[next] == '\n')
            {
                csubstr sub = s.range(pos, i);
                this->Writer::_do_write(sub);  // write everything up to (excluding) this char
                this->Writer::_do_write('\\'); // escape the whitespace
                pos = i;
            }
        }
        else if(C4_UNLIKELY(curr == '\r'))
        {
            csubstr sub = s.range(pos, i);
            this->Writer::_do_write(sub);  // write everything up to (excluding) this char
            this->Writer::_do_write("\\r"); // write the escaped char
            pos = i+1;
        }
    }
    // write missing characters at the end of the string
    if(pos < s.len)
    {
        csubstr sub = s.sub(pos);
        this->Writer::_do_write(sub);
    }
    this->Writer::_do_write('"');
}